

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_GetDefaultByType
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *ti;
  bool bVar1;
  int iVar2;
  BYTE *val;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00436ab1;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ti = (PClass *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ti != (PClass *)0x0) {
        bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,ti);
        if (!bVar1) {
          __assertion = "cls == NULL || cls->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_00436ab1;
        }
        val = ti->Defaults;
        goto LAB_00436a58;
      }
    }
    else if (ti != (PClass *)0x0) goto LAB_00436a79;
    val = (BYTE *)0x0;
LAB_00436a58:
    if (numret < 1) {
      iVar2 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1dd3,
                      "int AF_AActor_GetDefaultByType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar2 = 1;
      VMReturn::SetPointer(ret,val,1);
    }
    return iVar2;
  }
LAB_00436a79:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00436ab1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1dd2,
                "int AF_AActor_GetDefaultByType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetDefaultByType)
{
	PARAM_PROLOGUE;
	PARAM_CLASS(cls, AActor);
	ACTION_RETURN_OBJECT(cls == nullptr? nullptr : GetDefaultByType(cls));
}